

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim_component.cpp
# Opt level: O3

void __thiscall lsim::SimComponent::enable_user_values(SimComponent *this)

{
  pointer pVVar1;
  value_type local_4;
  
  pVVar1 = (this->m_user_values).super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_user_values).super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>._M_impl.
      super__Vector_impl_data._M_finish != pVVar1) {
    (this->m_user_values).super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar1;
  }
  std::vector<lsim::Value,_std::allocator<lsim::Value>_>::resize
            (&this->m_user_values,
             (long)(this->m_pins).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_pins).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 2,&local_4);
  return;
}

Assistant:

void SimComponent::enable_user_values() {
	m_user_values.clear();
	m_user_values.resize(m_pins.size(), VALUE_UNDEFINED);
}